

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall application::handle_command(application *this)

{
  error_code local_38;
  read_until_delim_op_v1<boost::asio::posix::basic_stream_descriptor<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_boost::asio::basic_streambuf_ref<std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_application_cpp:72:79)>
  local_28;
  
  local_28.stream_ = &this->_command_descriptor;
  local_28.buffers_.sb_ = &this->_command_buffer;
  local_28.delim_ = '\n';
  local_28.start_ = 0;
  local_28.search_position_ = 0;
  local_38.val_ = 0;
  local_38.failed_ = false;
  local_38.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_28.handler_.this = this;
  boost::asio::detail::
  read_until_delim_op_v1<boost::asio::posix::basic_stream_descriptor<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_boost::asio::basic_streambuf_ref<std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/backend/application.cpp:72:79)>
  ::operator()(&local_28,&local_38,0,1);
  return;
}

Assistant:

void application::handle_command()
{
    boost::asio::async_read_until(_command_descriptor, _command_buffer, '\n', [this](const boost::system::error_code& error_code, std::size_t length)
    {
        std::string request{boost::asio::buffers_begin(_command_buffer.data()), 
                            boost::asio::buffers_end(_command_buffer.data())};
        _command_buffer.consume(length);

        std::vector<std::string> results;
        boost::split(results, request, [](char c){return c == ' ';});

        std::pair<bool, node_type> src = string_to_node(results[0]);
        std::pair<bool, node_type> dst = string_to_node(results[1]);
        if(src.first == false || dst.first == false)
        {
            std::cout << "Wrong input for src/dst. Only D, P0, ..., P7, I1, ..., I4 allowed.\n";
            _command_buffer.consume(length);
            return;
        } 

        std::uint32_t passengers = 0;
        try
        {
            passengers = std::stoi(results[2]);
        }
        catch(const std::invalid_argument& e)
        {
            std::cout << "Wrong input for passenger count\n"; 
            handle_command();
            return;
        }
        
        _cab_manager.add_request(src.second, dst.second, passengers);
        handle_command();
    });
}